

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O3

void opengv::printBearingVectorArraysMatlab
               (bearingVectors_t *bearingVectors1,bearingVectors_t *bearingVectors2)

{
  pointer pMVar1;
  pointer pMVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  
  pMVar1 = (bearingVectors1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pMVar2 = (bearingVectors1->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ov1 = [",7);
  lVar4 = (long)pMVar2 - (long)pMVar1;
  if (lVar4 != 0) {
    lVar5 = (lVar4 >> 3) * -0x5555555555555555;
    lVar5 = lVar5 + (ulong)(lVar5 == 0);
    lVar4 = 0;
    do {
      *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
      poVar3 = std::ostream::_M_insert<double>
                         (*(double *)
                           ((long)&(((bearingVectors1->
                                     super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                   m_storage.m_data + lVar4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
      lVar4 = lVar4 + 0x18;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar4 = 8;
  do {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors1->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar4 = 0x10;
  do {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors1->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"];",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ov2 = [",7);
  lVar4 = 0;
  do {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xc0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar4 = 8;
  do {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 200);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,";",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  lVar4 = 0x10;
  do {
    *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(std::cout + -0x18)) = 10;
    poVar3 = std::ostream::_M_insert<double>
                       (*(double *)
                         ((long)&(((bearingVectors2->
                                   super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                 m_storage.m_data + lVar4));
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0xd0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"];",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '`');
  std::ostream::put('`');
  std::ostream::flush();
  return;
}

Assistant:

void
opengv::printBearingVectorArraysMatlab(
    const bearingVectors_t & bearingVectors1,
    const bearingVectors_t & bearingVectors2 )
{
  size_t numberBearingVectors = bearingVectors1.size();

  //temp: print the vectors in matlab format (for debugging purposes)
  size_t precision = 10;
  std::cout << "ov1 = [";
  for( size_t i = 0; i < numberBearingVectors; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors1[i](2,0) << " ";
  std::cout << "];" << std::endl;
  std::cout << "ov2 = [";
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](0,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](1,0) << " ";
  std::cout << ";" << std::endl;
  for( size_t i = 0; i < 8; i++ )
    std::cout << std::setprecision(precision) << bearingVectors2[i](2,0) << " ";
  std::cout << "];" << std::endl;
}